

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic_simplification.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ArithmeticSimplificationRule::Apply
          (ArithmeticSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  string *__lhs;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  Value *this_01;
  bool bVar1;
  reference pvVar2;
  BoundFunctionExpression *pBVar3;
  BoundConstantExpression *pBVar4;
  reference pvVar5;
  InternalException *this_02;
  pointer *__ptr;
  size_type __n;
  LogicalType *this_03;
  _func_int **local_f8;
  BoundConstantExpression *local_f0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e8;
  Value local_e0;
  LogicalType local_a0;
  LogicalType local_88;
  Value local_70;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar2->_M_data->super_BaseExpression);
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  pBVar4 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar2->_M_data->super_BaseExpression);
  this_00 = &pBVar3->children;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(this_00,0);
  if ((pBVar4->value).is_null == true) {
    LogicalType::LogicalType(&local_88,&(pBVar3->super_Expression).return_type);
    Value::Value(&local_e0,&local_88);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_f8,&local_e0);
    (this->super_Rule)._vptr_Rule = local_f8;
    local_f8 = (_func_int **)0x0;
    Value::~Value(&local_e0);
    this_03 = &local_88;
LAB_00587e0e:
    LogicalType::~LogicalType(this_03);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  local_f0 = (BoundConstantExpression *)
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  this_01 = &pBVar4->value;
  __lhs = &(pBVar3->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  bVar1 = ::std::operator==(__lhs,"+");
  if (bVar1) {
    local_e0.type_.id_ = INVALID;
    local_e0.type_.physical_type_ = ~INVALID;
    local_e0.type_._2_6_ = 0;
    bVar1 = Value::operator==(this_01,(int64_t *)&local_e0);
    if (!bVar1) goto LAB_0058800f;
LAB_00587e55:
    __n = (size_type)(local_f0 == pBVar4);
  }
  else {
    bVar1 = ::std::operator==(__lhs,"-");
    if (bVar1) {
      if (local_f0 == pBVar4) {
LAB_0058800f:
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
      }
      local_e0.type_.id_ = INVALID;
      local_e0.type_.physical_type_ = ~INVALID;
      local_e0.type_._2_6_ = 0;
      bVar1 = Value::operator==(this_01,(int64_t *)&local_e0);
      if (!bVar1) goto LAB_0058800f;
    }
    else {
      bVar1 = ::std::operator==(__lhs,anon_var_dwarf_4b71f34 + 8);
      if (bVar1) {
        local_e0.type_.id_ = SQLNULL;
        local_e0.type_.physical_type_ = ~INVALID;
        local_e0.type_._2_6_ = 0;
        bVar1 = Value::operator==(this_01,(int64_t *)&local_e0);
        if (!bVar1) {
          local_e0.type_.id_ = INVALID;
          local_e0.type_.physical_type_ = ~INVALID;
          local_e0.type_._2_6_ = 0;
          bVar1 = Value::operator==(this_01,(int64_t *)&local_e0);
          if (bVar1) {
            pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::get<true>(this_00,(ulong)(local_f0 == pBVar4));
            local_e8._M_head_impl =
                 (pvVar5->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            Value::Numeric(&local_70,&(pBVar3->super_Expression).return_type,0);
            ExpressionRewriter::ConstantOrNull
                      ((ExpressionRewriter *)this,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_e8,&local_70);
            Value::~Value(&local_70);
            if (local_e8._M_head_impl == (Expression *)0x0) {
              return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
                     this;
            }
            (*((local_e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
                   this;
          }
          goto LAB_0058800f;
        }
        goto LAB_00587e55;
      }
      bVar1 = ::std::operator==(__lhs,"//");
      if (!bVar1) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"Unrecognized function name in ArithmeticSimplificationRule",
                   (allocator *)&local_f8);
        InternalException::InternalException(this_02,(string *)&local_e0);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_f0 == pBVar4) goto LAB_0058800f;
      local_e0.type_.id_ = SQLNULL;
      local_e0.type_.physical_type_ = ~INVALID;
      local_e0.type_._2_6_ = 0;
      bVar1 = Value::operator==(this_01,(int64_t *)&local_e0);
      if (!bVar1) {
        local_e0.type_.id_ = INVALID;
        local_e0.type_.physical_type_ = ~INVALID;
        local_e0.type_._2_6_ = 0;
        bVar1 = Value::operator==(this_01,(int64_t *)&local_e0);
        if (bVar1) {
          LogicalType::LogicalType(&local_a0,&(pBVar3->super_Expression).return_type);
          Value::Value(&local_e0,&local_a0);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_f8,&local_e0);
          (this->super_Rule)._vptr_Rule = local_f8;
          local_f8 = (_func_int **)0x0;
          Value::~Value(&local_e0);
          this_03 = &local_a0;
          goto LAB_00587e0e;
        }
        goto LAB_0058800f;
      }
    }
    __n = 0;
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(this_00,__n);
  (this->super_Rule)._vptr_Rule =
       (_func_int **)
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
}

Assistant:

unique_ptr<Expression> ArithmeticSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                           bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	auto &constant = bindings[1].get().Cast<BoundConstantExpression>();
	idx_t constant_child = root.children[0].get() == &constant ? 0 : 1;
	D_ASSERT(root.children.size() == 2);
	(void)root;
	// any arithmetic operator involving NULL is always NULL
	if (constant.value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(root.return_type));
	}
	auto &func_name = root.function.name;
	if (func_name == "+") {
		if (constant.value == 0) {
			// addition with 0
			// we can remove the entire operator and replace it with the non-constant child
			return std::move(root.children[1 - constant_child]);
		}
	} else if (func_name == "-") {
		if (constant_child == 1 && constant.value == 0) {
			// subtraction by 0
			// we can remove the entire operator and replace it with the non-constant child
			return std::move(root.children[1 - constant_child]);
		}
	} else if (func_name == "*") {
		if (constant.value == 1) {
			// multiply with 1, replace with non-constant child
			return std::move(root.children[1 - constant_child]);
		} else if (constant.value == 0) {
			// multiply by zero: replace with constant or null
			return ExpressionRewriter::ConstantOrNull(std::move(root.children[1 - constant_child]),
			                                          Value::Numeric(root.return_type, 0));
		}
	} else if (func_name == "//") {
		if (constant_child == 1) {
			if (constant.value == 1) {
				// divide by 1, replace with non-constant child
				return std::move(root.children[1 - constant_child]);
			} else if (constant.value == 0) {
				// divide by 0, replace with NULL
				return make_uniq<BoundConstantExpression>(Value(root.return_type));
			}
		}
	} else {
		throw InternalException("Unrecognized function name in ArithmeticSimplificationRule");
	}
	return nullptr;
}